

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1284:26)>
::getImpl(SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1284:26)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  ExceptionOr<int> depResult;
  DebugExpression<bool_&> local_378;
  ExceptionOr<int> local_370;
  ExceptionOrValue local_1d0;
  char local_38;
  int local_34;
  
  local_1d0.exception.ptr.isSet = false;
  local_38 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1d0);
  uVar1 = local_1d0.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_1d0.exception.ptr.isSet == true) {
    local_370.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1d0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1d0.exception.ptr.field_1.value.ownFile.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1d0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1d0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1d0.exception.ptr.field_1.value.file;
    local_370.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1d0.exception.ptr.field_1._32_8_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1d0.exception.ptr.field_1.value.description.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1d0.exception.ptr.field_1.value.description.content.size_;
    local_1d0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1d0.exception.ptr.field_1.value.description.content.disposer;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1d0.exception.ptr.field_1.value.context.ptr.disposer;
    local_1d0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar1;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1d0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_370.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1d0.exception.ptr.field_1 + 0x68),0x105);
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1d0.exception.ptr.field_1.value.details.builder.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1d0.exception.ptr.field_1.value.details.builder.pos;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1d0.exception.ptr.field_1.value.details.builder.endPtr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1d0.exception.ptr.field_1.value.details.builder.disposer;
    local_1d0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1d0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1d0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_370.value.ptr.isSet = false;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_370);
  }
  else {
    if (local_38 != '\x01') goto LAB_0019cbb5;
    local_378.value = (this->func).destroyed;
    if ((*local_378.value == false) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x505,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
                 (char (*) [27])"failed: expected destroyed",&local_378);
    }
    local_370.value.ptr.field_1.value = local_34 + 0x141;
    local_370.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_370.value.ptr.isSet = true;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_370);
  }
  if (local_370.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_370.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0019cbb5:
  if (local_1d0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }